

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

bool __thiscall
ON_SerialNumberMap::IsValid(ON_SerialNumberMap *this,bool bBuildHashTable,ON_TextLog *textlog)

{
  ON_SN_BLOCK *pOVar1;
  SN_ELEMENT *pSVar2;
  bool bVar3;
  bool bVar4;
  ON__UINT32 OVar5;
  SN_ELEMENT ***pppSVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  SN_ELEMENT **ppSVar12;
  ON__UINT64 aic;
  ON__UINT32 *local_48;
  SN_ELEMENT ****local_40;
  ON__UINT64 local_38;
  
  local_38 = 0;
  if (this->m_active_id_count == 0 || bBuildHashTable) {
    if (this->m_active_id_count != 0) {
      if ((this->m_bHashTableIsValid == '\0') &&
         (((Internal_HashTableBuild(this), this->m_bHashTableIsValid == '\0' ||
           (this->m_hash_table_blocks == (SN_ELEMENT ***)0x0)) || (this->m_hash_block_count == 0))))
      {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"Unable to build hash table.\n");
        }
        bVar3 = ON_IsNotValid();
        return bVar3;
      }
      goto LAB_004ea908;
    }
LAB_004ea926:
    pppSVar6 = (SN_ELEMENT ***)0x0;
    bVar3 = false;
    OVar5 = 0;
  }
  else {
    if (this->m_bHashTableIsValid == '\0') goto LAB_004ea926;
LAB_004ea908:
    pppSVar6 = this->m_hash_table_blocks;
    OVar5 = this->m_hash_block_count;
    bVar3 = true;
  }
  local_40 = &this->m_hash_table_blocks;
  local_48 = &this->m_hash_block_count;
  bVar4 = ON_SN_BLOCK::IsValidBlock(this->m_sn_block0,textlog,pppSVar6,OVar5,&local_38);
  if (bVar4) {
    uVar11 = (ulong)this->m_sn_block0->m_count;
    uVar9 = (ulong)this->m_sn_block0->m_purged;
    for (uVar8 = 0; uVar8 < this->m_snblk_list_count; uVar8 = uVar8 + 1) {
      pOVar1 = this->m_snblk_list[uVar8];
      if (pOVar1->m_count == 0) {
        if (textlog != (ON_TextLog *)0x0) {
          pcVar7 = "m_snblk_list[%d] is empty\n";
LAB_004eaaa5:
          ON_TextLog::Print(textlog,pcVar7,uVar8);
        }
        goto LAB_004eab09;
      }
      if (pOVar1->m_sorted != 1) {
        if (textlog != (ON_TextLog *)0x0) {
          pcVar7 = "m_snblk_list[%d] is not sorted\n";
          goto LAB_004eaaa5;
        }
        goto LAB_004eab09;
      }
      if (bVar3) {
        pppSVar6 = *local_40;
        OVar5 = *local_48;
      }
      else {
        pppSVar6 = (SN_ELEMENT ***)0x0;
        OVar5 = 0;
      }
      bVar4 = ON_SN_BLOCK::IsValidBlock(pOVar1,textlog,pppSVar6,OVar5,&local_38);
      if (!bVar4) {
        if (textlog != (ON_TextLog *)0x0) {
          pcVar7 = "m_snblk_list[%d] is not valid\n";
          goto LAB_004eaaa5;
        }
        goto LAB_004eab09;
      }
      pOVar1 = this->m_snblk_list[uVar8];
      if ((uVar8 != 0) && (pOVar1->m_sn0 <= this->m_snblk_list[uVar8 - 1]->m_sn1)) {
        if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
        pcVar7 = "m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n";
        uVar11 = uVar8 - 1;
        goto LAB_004eab02;
      }
      uVar11 = uVar11 + pOVar1->m_count;
      uVar9 = uVar9 + pOVar1->m_purged;
    }
    uVar8 = this->m_sn_count;
    if (uVar11 == uVar8) {
      uVar8 = this->m_sn_purged;
      if (uVar9 == uVar8) {
        uVar8 = this->m_active_id_count;
        if (uVar8 == local_38) {
          if (uVar8 + uVar9 <= uVar11) {
            if (!bVar3) {
              return true;
            }
            uVar9 = 0;
            for (uVar11 = 0; uVar11 < *local_48; uVar11 = uVar11 + 1) {
              for (uVar10 = 0; uVar10 != 0xffa; uVar10 = uVar10 + 1) {
                ppSVar12 = (*local_40)[uVar11] + uVar10;
                for (; (pSVar2 = *ppSVar12, pSVar2 != (SN_ELEMENT *)0x0 && (uVar9 <= uVar8));
                    uVar9 = uVar9 + 1) {
                  if ((uVar11 != (ulong)pSVar2->m_id_crc32 % (ulong)*local_48) ||
                     (uVar10 != ((ulong)pSVar2->m_id_crc32 / 0xffa) % 0xffa)) {
                    if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
                    pcVar7 = "m_hash_table linked lists are corrupt.\n";
                    goto LAB_004eaa08;
                  }
                  ppSVar12 = &pSVar2->m_next;
                }
              }
            }
            if (uVar9 <= uVar8) {
              return true;
            }
            if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
            pcVar7 = "m_hash_table[] linked lists have too many elements.\n";
            goto LAB_004eaa08;
          }
          if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
          uVar11 = uVar11 - uVar9;
          pcVar7 = "m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n";
        }
        else {
          if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
          pcVar7 = "m_active_id_count=%d (should be %d) is not correct\n";
          uVar11 = local_38;
        }
      }
      else {
        if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
        pcVar7 = "m_sn_purged=%d (should be %d) is not correct\n";
        uVar11 = uVar9;
      }
    }
    else {
      if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
      pcVar7 = "m_sn_count=%d (should be %d) is not correct\n";
    }
LAB_004eab02:
    ON_TextLog::Print(textlog,pcVar7,uVar8,uVar11);
  }
  else {
    if (textlog == (ON_TextLog *)0x0) goto LAB_004eab09;
    pcVar7 = "m_sn_block0 is not valid\n";
LAB_004eaa08:
    ON_TextLog::Print(textlog,pcVar7);
  }
LAB_004eab09:
  bVar3 = ON_IsNotValid();
  return bVar3;
}

Assistant:

bool ON_SerialNumberMap::IsValid(
   bool bBuildHashTable,
   ON_TextLog* textlog
   ) const
{
  ON__UINT64 i, c, pc, aic;

  aic = 0;

  const bool bTestHashTable = (m_active_id_count > 0 && (bBuildHashTable || m_bHashTableIsValid));
  if (bTestHashTable && false == m_bHashTableIsValid)
  {
    const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableBuild();
    if (false == m_bHashTableIsValid || nullptr == m_hash_table_blocks || m_hash_block_count <= 0)
    {
      if ( textlog )
        textlog->Print("Unable to build hash table.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( !m_sn_block0.IsValidBlock(
    textlog,
    bTestHashTable ? m_hash_table_blocks : nullptr,
    bTestHashTable ? m_hash_block_count : 0,
    &aic) 
    )
  {
    if ( textlog )
      textlog->Print("m_sn_block0 is not valid\n");
    return ON_SerialNumberMap_IsNotValid();
  }

  c = m_sn_block0.m_count;
  pc = m_sn_block0.m_purged;

  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is empty\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( 1 != m_snblk_list[i]->m_sorted )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not sorted\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( !m_snblk_list[i]->IsValidBlock(
      textlog,
      bTestHashTable ? m_hash_table_blocks : nullptr,
      bTestHashTable ? m_hash_block_count : 0,
      &aic) 
      )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not valid\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    c += m_snblk_list[i]->m_count;
    pc += m_snblk_list[i]->m_purged;
    if ( i>0 && m_snblk_list[i]->m_sn0 <= m_snblk_list[i-1]->m_sn1 )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n",i,i-1);
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( c != m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_sn_count=%d (should be %d) is not correct\n",m_sn_count,c);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( pc != m_sn_purged )
  {
    if ( textlog )
      textlog->Print("m_sn_purged=%d (should be %d) is not correct\n",m_sn_purged,pc);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count != aic )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d (should be %d) is not correct\n",m_active_id_count,aic);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count + m_sn_purged > m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n",m_active_id_count,m_sn_count-m_sn_purged);
    return ON_SerialNumberMap_IsNotValid();
  }

  if (bTestHashTable)
  {
    c = 0;
    for (ON__UINT32 hash_block_index = 0; hash_block_index < m_hash_block_count; hash_block_index++)
    {
      const SN_ELEMENT*const* hash_table_block = m_hash_table_blocks[hash_block_index];
      for (ON__UINT32 hash_i = 0; hash_i < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY; hash_i++)
      {
        for (const SN_ELEMENT* e = hash_table_block[hash_i]; nullptr != e && c <= m_active_id_count; e = e->m_next)
        {
          if (
            hash_block_index != Internal_HashTableBlockIndex(e->m_id_crc32)
            || hash_i != ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32)
            )
          {
            if (textlog)
              textlog->Print("m_hash_table linked lists are corrupt.\n");
            return ON_SerialNumberMap_IsNotValid();
          }
          c++;
        }
      }
    }

    if (c > m_active_id_count)
    {
      if (textlog)
        textlog->Print("m_hash_table[] linked lists have too many elements.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  return true;
}